

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.cc
# Opt level: O0

MoveList * search::movegen::generateAll(MoveList *__return_storage_ptr__,Board *pos,bool onlyCaps)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  bool bVar8;
  int local_58;
  int local_54;
  int i_1;
  int pceNum_2;
  int index_1;
  int i;
  int pceNum_1;
  int index;
  int pceNum;
  int local_30;
  int targetSquare;
  int direction;
  int offset;
  int piece;
  int square;
  bool onlyCaps_local;
  Board *pos_local;
  MoveList *moves;
  
  MoveList::MoveList(__return_storage_ptr__);
  iVar1 = board::Board::getSide(pos);
  if (iVar1 == 0) {
    direction = 1;
  }
  else {
    direction = 7;
  }
  iVar1 = board::Board::getSide(pos);
  if (iVar1 == 0) {
    targetSquare = 1;
  }
  else {
    targetSquare = -1;
  }
  for (pceNum_1 = 0; iVar1 = board::Board::getPieceNum(pos,direction), pceNum_1 < iVar1;
      pceNum_1 = pceNum_1 + 1) {
    piVar6 = board::Board::getPieceList(pos,direction);
    iVar1 = piVar6[pceNum_1];
    if ((!onlyCaps) && (iVar2 = board::Board::getSquare(pos,iVar1 + targetSquare * 10), iVar2 == 0))
    {
      iVar2 = board::Board::getSide(pos);
      addPawnMove(iVar1,iVar1 + targetSquare * 10,0,iVar2,__return_storage_ptr__,pos);
      iVar2 = board::Board::RANKS[board::Board::SQ64[iVar1]];
      uVar3 = board::Board::getSide(pos);
      if ((iVar2 == *(int *)((long)&PAWN_RANK + (long)(int)(uVar3 ^ 1) * 4)) &&
         (iVar2 = board::Board::getSquare(pos,iVar1 + targetSquare * 0x14), iVar2 == 0)) {
        iVar2 = board::Move::MOVE(iVar1,iVar1 + targetSquare * 0x14,0,0,0x80000);
        addQuietMove(iVar2,__return_storage_ptr__,pos);
      }
    }
    if (board::Board::SQ64[iVar1 + targetSquare * 9] != 99) {
      iVar2 = board::Board::getSquare(pos,iVar1 + targetSquare * 9);
      uVar3 = board::Board::PIECE_COLOR[iVar2];
      uVar4 = board::Board::getSide(pos);
      if (uVar3 == (uVar4 ^ 1)) {
        iVar7 = iVar1 + targetSquare * 9;
        iVar2 = board::Board::getSquare(pos,iVar7);
        iVar5 = board::Board::getSide(pos);
        addPawnMove(iVar1,iVar7,iVar2,iVar5,__return_storage_ptr__,pos);
      }
    }
    if (board::Board::SQ64[iVar1 + targetSquare * 0xb] != 99) {
      iVar2 = board::Board::getSquare(pos,iVar1 + targetSquare * 0xb);
      uVar3 = board::Board::PIECE_COLOR[iVar2];
      uVar4 = board::Board::getSide(pos);
      if (uVar3 == (uVar4 ^ 1)) {
        iVar7 = iVar1 + targetSquare * 0xb;
        iVar2 = board::Board::getSquare(pos,iVar7);
        iVar5 = board::Board::getSide(pos);
        addPawnMove(iVar1,iVar7,iVar2,iVar5,__return_storage_ptr__,pos);
      }
    }
    iVar2 = board::Board::getEnPas(pos);
    if (iVar2 != 99) {
      iVar2 = board::Board::getEnPas(pos);
      if (iVar1 + targetSquare * 9 == iVar2) {
        iVar2 = board::Move::MOVE(iVar1,iVar1 + targetSquare * 9,0,0,0x40000);
        addEnPasMove(iVar2,__return_storage_ptr__);
      }
      iVar2 = board::Board::getEnPas(pos);
      if (iVar1 + targetSquare * 0xb == iVar2) {
        iVar1 = board::Move::MOVE(iVar1,iVar1 + targetSquare * 0xb,0,0,0x40000);
        addEnPasMove(iVar1,__return_storage_ptr__);
      }
    }
  }
  iVar1 = board::Board::getSide(pos);
  if (iVar1 == 0) {
    targetSquare = 0;
  }
  else {
    targetSquare = 3;
  }
  i = 0;
  do {
    if (2 < i) {
      iVar1 = board::Board::getSide(pos);
      if (iVar1 == 0) {
        targetSquare = 0;
      }
      else {
        targetSquare = 2;
      }
      for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
        iVar1 = *(int *)(NON_SLIDERS + (long)(i_1 + targetSquare) * 4);
        for (local_54 = 0; iVar2 = board::Board::getPieceNum(pos,iVar1), local_54 < iVar2;
            local_54 = local_54 + 1) {
          piVar6 = board::Board::getPieceList(pos,iVar1);
          iVar2 = piVar6[local_54];
          local_58 = 0;
          while( true ) {
            bVar8 = false;
            if (local_58 < 8) {
              bVar8 = board::Board::MOVE_DIR[iVar1][local_58] != 0;
            }
            if (!bVar8) break;
            iVar5 = iVar2 + board::Board::MOVE_DIR[iVar1][local_58];
            iVar7 = board::Board::getSquare(pos,iVar5);
            if (iVar7 != 99) {
              iVar7 = board::Board::getSquare(pos,iVar5);
              if (iVar7 == 0) {
                if (!onlyCaps) {
                  iVar5 = board::Move::MOVE(iVar2,iVar5,0,0,0);
                  addQuietMove(iVar5,__return_storage_ptr__,pos);
                }
              }
              else {
                iVar7 = board::Board::getSquare(pos,iVar5);
                uVar3 = board::Board::PIECE_COLOR[iVar7];
                uVar4 = board::Board::getSide(pos);
                if (uVar3 == (uVar4 ^ 1)) {
                  iVar7 = board::Board::getSquare(pos,iVar5);
                  iVar5 = board::Move::MOVE(iVar2,iVar5,iVar7,0,0);
                  addCaptureMove(iVar5,__return_storage_ptr__,pos);
                }
              }
            }
            local_58 = local_58 + 1;
          }
        }
      }
      if (!onlyCaps) {
        iVar1 = board::Board::getSide(pos);
        if (iVar1 == 0) {
          uVar3 = board::Board::getCastlePerm(pos);
          if ((((uVar3 & 1) != 0) && (iVar1 = board::Board::getSquare(pos,0x1a), iVar1 == 0)) &&
             ((iVar1 = board::Board::getSquare(pos,0x1b), iVar1 == 0 &&
              ((bVar8 = board::Board::sqAttacked(pos,0x19,1), !bVar8 &&
               (bVar8 = board::Board::sqAttacked(pos,0x1a,1), !bVar8)))))) {
            iVar1 = board::Move::MOVE(0x19,0x1b,0,0,0x1000000);
            addQuietMove(iVar1,__return_storage_ptr__,pos);
          }
          uVar3 = board::Board::getCastlePerm(pos);
          if ((((((uVar3 & 2) != 0) && (iVar1 = board::Board::getSquare(pos,0x18), iVar1 == 0)) &&
               (iVar1 = board::Board::getSquare(pos,0x17), iVar1 == 0)) &&
              ((iVar1 = board::Board::getSquare(pos,0x16), iVar1 == 0 &&
               (bVar8 = board::Board::sqAttacked(pos,0x19,1), !bVar8)))) &&
             (bVar8 = board::Board::sqAttacked(pos,0x18,1), !bVar8)) {
            iVar1 = board::Move::MOVE(0x19,0x17,0,0,0x1000000);
            addQuietMove(iVar1,__return_storage_ptr__,pos);
          }
        }
        else {
          uVar3 = board::Board::getCastlePerm(pos);
          if (((((uVar3 & 4) != 0) && (iVar1 = board::Board::getSquare(pos,0x60), iVar1 == 0)) &&
              (iVar1 = board::Board::getSquare(pos,0x61), iVar1 == 0)) &&
             ((bVar8 = board::Board::sqAttacked(pos,0x5f,0), !bVar8 &&
              (bVar8 = board::Board::sqAttacked(pos,0x60,0), !bVar8)))) {
            iVar1 = board::Move::MOVE(0x5f,0x61,0,0,0x1000000);
            addQuietMove(iVar1,__return_storage_ptr__,pos);
          }
          uVar3 = board::Board::getCastlePerm(pos);
          if ((((uVar3 & 8) != 0) && (iVar1 = board::Board::getSquare(pos,0x5e), iVar1 == 0)) &&
             ((iVar1 = board::Board::getSquare(pos,0x5d), iVar1 == 0 &&
              (((iVar1 = board::Board::getSquare(pos,0x5c), iVar1 == 0 &&
                (bVar8 = board::Board::sqAttacked(pos,0x5f,0), !bVar8)) &&
               (bVar8 = board::Board::sqAttacked(pos,0x5e,0), !bVar8)))))) {
            iVar1 = board::Move::MOVE(0x5f,0x5d,0,0,0x1000000);
            addQuietMove(iVar1,__return_storage_ptr__,pos);
          }
        }
      }
      return __return_storage_ptr__;
    }
    iVar1 = *(int *)(SLIDERS + (long)(i + targetSquare) * 4);
    for (index_1 = 0; iVar2 = board::Board::getPieceNum(pos,iVar1), index_1 < iVar2;
        index_1 = index_1 + 1) {
      piVar6 = board::Board::getPieceList(pos,iVar1);
      iVar2 = piVar6[index_1];
      pceNum_2 = 0;
      while( true ) {
        bVar8 = false;
        if (pceNum_2 < 8) {
          bVar8 = board::Board::MOVE_DIR[iVar1][pceNum_2] != 0;
        }
        if (!bVar8) break;
        iVar5 = board::Board::MOVE_DIR[iVar1][pceNum_2];
        local_30 = iVar2;
        while( true ) {
          local_30 = local_30 + iVar5;
          iVar7 = board::Board::getSquare(pos,local_30);
          if (iVar7 == 99) break;
          iVar7 = board::Board::getSquare(pos,local_30);
          if (iVar7 != 0) {
            iVar5 = board::Board::getSquare(pos,local_30);
            uVar3 = board::Board::PIECE_COLOR[iVar5];
            uVar4 = board::Board::getSide(pos);
            if (uVar3 == (uVar4 ^ 1)) {
              iVar5 = board::Board::getSquare(pos,local_30);
              iVar5 = board::Move::MOVE(iVar2,local_30,iVar5,0,0);
              addCaptureMove(iVar5,__return_storage_ptr__,pos);
            }
            break;
          }
          if (!onlyCaps) {
            iVar7 = board::Move::MOVE(iVar2,local_30,0,0,0);
            addQuietMove(iVar7,__return_storage_ptr__,pos);
          }
        }
        pceNum_2 = pceNum_2 + 1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

search::MoveList search::movegen::generateAll(board::Board& pos, const bool onlyCaps)
{
    MoveList moves;
    int square;
    int piece;
    int offset;
    int direction;
    int targetSquare;
    pos.getSide() == board::WHITE ? piece = board::WP : piece = board::BP;
    pos.getSide() == board::WHITE ? offset = 1 : offset = -1;
    for (int pceNum = 0; pceNum < pos.getPieceNum(piece); pceNum++) {
        square = pos.getPieceList(piece)[pceNum];
        if (!onlyCaps) {
            if (pos.getSquare(square + offset * 10) == board::EMPTY) {
                addPawnMove(square, square + offset * 10, board::EMPTY, pos.getSide(), moves, pos);
                if (board::Board::RANKS[board::Board::SQ64[square]] == PAWN_RANK[(pos.getSide() ^ 1)] &&
                    pos.getSquare(square + offset * 20) == board::EMPTY) {
                    addQuietMove(board::Move::MOVE(square, square + offset * 20, board::EMPTY, board::EMPTY,
                                                   board::Move::MFLAGPS),
                                 moves, pos);
                }
            }
        }
        if (board::Board::SQ64[square + offset * 9] != board::NO_SQ &&
            board::Board::PIECE_COLOR[pos.getSquare(square + offset * 9)] == (pos.getSide() ^ 1)) {
            addPawnMove(square, square + offset * 9, pos.getSquare(square + offset * 9), pos.getSide(), moves, pos);
        }
        if (board::Board::SQ64[square + offset * 11] != board::NO_SQ &&
            board::Board::PIECE_COLOR[pos.getSquare(square + offset * 11)] == (pos.getSide() ^ 1)) {
            addPawnMove(square, square + offset * 11, pos.getSquare(square + offset * 11), pos.getSide(), moves, pos);
        }
        if (pos.getEnPas() != board::NO_SQ) {
            if (square + offset * 9 == pos.getEnPas()) {
                addEnPasMove(
                    board::Move::MOVE(square, square + offset * 9, board::EMPTY, board::EMPTY, board::Move::MFLAGEP),
                    moves);
            }
            if (square + offset * 11 == pos.getEnPas()) {
                addEnPasMove(
                    board::Move::MOVE(square, square + offset * 11, board::EMPTY, board::EMPTY, board::Move::MFLAGEP),
                    moves);
            }
        }
    }
    pos.getSide() == board::WHITE ? offset = 0 : offset = 3;
    for (int index = 0; index < 3; index++) {
        piece = SLIDERS[index + offset];
        for (int pceNum = 0; pceNum < pos.getPieceNum(piece); pceNum++) {
            square = pos.getPieceList(piece)[pceNum];
            for (int i = 0; i < 8 && board::Board::MOVE_DIR[piece][i] != 0; i++) {
                direction = board::Board::MOVE_DIR[piece][i];
                targetSquare = square + direction;
                while (pos.getSquare(targetSquare) != board::NO_SQ) {
                    if (pos.getSquare(targetSquare) != board::EMPTY) {
                        if (board::Board::PIECE_COLOR[pos.getSquare(targetSquare)] == (pos.getSide() ^ 1)) {
                            addCaptureMove(
                                board::Move::MOVE(square, targetSquare, pos.getSquare(targetSquare), board::EMPTY, 0),
                                moves, pos);
                        }
                        break;
                    }
                    if (!onlyCaps) {
                        addQuietMove(board::Move::MOVE(square, targetSquare, board::EMPTY, board::EMPTY, 0), moves,
                                     pos);
                    }
                    targetSquare += direction;
                }
            }
        }
    }
    pos.getSide() == board::WHITE ? offset = 0 : offset = 2;
    for (int index = 0; index < 2; index++) {
        piece = NON_SLIDERS[index + offset];
        for (int pceNum = 0; pceNum < pos.getPieceNum(piece); pceNum++) {
            square = pos.getPieceList(piece)[pceNum];
            for (int i = 0; i < 8 && board::Board::MOVE_DIR[piece][i] != 0; i++) {
                direction = board::Board::MOVE_DIR[piece][i];
                targetSquare = square + direction;
                if (pos.getSquare(targetSquare) == board::NO_SQ) {
                    continue;
                }
                if (pos.getSquare(targetSquare) != board::EMPTY) {
                    if (board::Board::PIECE_COLOR[pos.getSquare(targetSquare)] == (pos.getSide() ^ 1)) {
                        addCaptureMove(
                            board::Move::MOVE(square, targetSquare, pos.getSquare(targetSquare), board::EMPTY, 0),
                            moves, pos);
                    }
                    continue;
                }
                if (!onlyCaps) {
                    addQuietMove(board::Move::MOVE(square, targetSquare, board::EMPTY, board::EMPTY, 0), moves, pos);
                }
            }
        }
    }
    if (!onlyCaps) {
        if (pos.getSide() == board::WHITE) {
            if (pos.getCastlePerm() & board::WKCA) {
                if (pos.getSquare(board::F1) == board::EMPTY && pos.getSquare(board::G1) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E1, board::BLACK) && !pos.sqAttacked(board::F1, board::BLACK)) {
                        addQuietMove(
                            board::Move::MOVE(board::E1, board::G1, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
            if (pos.getCastlePerm() & board::WQCA) {
                if (pos.getSquare(board::D1) == board::EMPTY && pos.getSquare(board::C1) == board::EMPTY &&
                    pos.getSquare(board::B1) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E1, board::BLACK) && !pos.sqAttacked(board::D1, board::BLACK)) {
                        addQuietMove(
                            board::Move::MOVE(board::E1, board::C1, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
        }
        else {
            if (pos.getCastlePerm() & board::BKCA) {
                if (pos.getSquare(board::F8) == board::EMPTY && pos.getSquare(board::G8) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E8, board::WHITE) && !pos.sqAttacked(board::F8, board::WHITE)) {
                        addQuietMove(
                            board::Move::MOVE(board::E8, board::G8, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
            if (pos.getCastlePerm() & board::BQCA) {
                if (pos.getSquare(board::D8) == board::EMPTY && pos.getSquare(board::C8) == board::EMPTY &&
                    pos.getSquare(board::B8) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E8, board::WHITE) && !pos.sqAttacked(board::D8, board::WHITE)) {
                        addQuietMove(
                            board::Move::MOVE(board::E8, board::C8, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
        }
    }
    return moves;
}